

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_accessBufferTest_Test::TestBody
          (OpenDDLParserTest_accessBufferTest_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  char *buffer_00;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *in_R9;
  AssertHelper local_1a0;
  Message local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_2;
  Message local_178;
  size_t local_170;
  undefined4 local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_130;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_108 [7];
  bool success;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  size_t i_1;
  char *parserBuffer;
  bool equal;
  Message local_a8;
  size_t local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  undefined1 local_78 [8];
  OpenDDLParser myParser;
  size_t i;
  char *buffer;
  OpenDDLParserTest_accessBufferTest_Test *this_local;
  
  buffer_00 = (char *)operator_new__(100);
  for (myParser.m_context = (Context *)0x0; myParser.m_context < (Context *)0x64;
      myParser.m_context = (Context *)((long)&(myParser.m_context)->m_root + 1)) {
    buffer_00[(long)myParser.m_context] = (char)myParser.m_context;
  }
  OpenDDLParser::OpenDDLParser((OpenDDLParser *)local_78);
  OpenDDLParser::setBuffer((OpenDDLParser *)local_78,buffer_00,100);
  local_a0 = OpenDDLParser::getBufferSize((OpenDDLParser *)local_78);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"len","myParser.getBufferSize()",&TestBody::len,&local_a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0xb0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff50,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  parserBuffer._7_1_ = true;
  pcVar3 = OpenDDLParser::getBuffer((OpenDDLParser *)local_78);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  do {
    sVar1.ptr_ = gtest_ar_.message_.ptr_;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenDDLParser::getBufferSize((OpenDDLParser *)local_78);
    if (pbVar4 <= sVar1.ptr_) {
LAB_0016294e:
      testing::AssertionResult::AssertionResult((AssertionResult *)local_d8,parserBuffer._7_1_);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar2) {
        testing::Message::Message(&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_108,(internal *)local_d8,(AssertionResult *)"equal","false",
                   "true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0xbd,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        std::__cxx11::string::~string((string *)local_108);
        testing::Message::~Message(&local_e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      gtest_ar__1.message_.ptr_._7_1_ = 1;
      OpenDDLParser::clear((OpenDDLParser *)local_78);
      buffer_00[1] = 'c';
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)local_120,(bool)(gtest_ar__1.message_.ptr_._7_1_ & 1));
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
      if (!bVar2) {
        testing::Message::Message(&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_120,(AssertionResult *)0x1a859b,
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0xc6,pcVar3);
        testing::internal::AssertHelper::operator=(&local_130,&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_128);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
      OpenDDLParser::setBuffer((OpenDDLParser *)local_78,buffer_00,100);
      OpenDDLParser::clear((OpenDDLParser *)local_78);
      local_164 = 0;
      local_170 = OpenDDLParser::getBufferSize((OpenDDLParser *)local_78);
      testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
                (local_160,"0U",(uint *)"myParser.getBufferSize()",(unsigned_long *)&local_164,
                 &local_170);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
      if (!bVar2) {
        testing::Message::Message(&local_178);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0xca,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_178);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_178);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      pcVar3 = OpenDDLParser::getBuffer((OpenDDLParser *)local_78);
      testing::internal::EqHelper<true>::Compare<char_const>
                ((EqHelper<true> *)local_190,"nullptr","myParser.getBuffer()",(Secret *)0x0,pcVar3);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
      if (!bVar2) {
        testing::Message::Message(&local_198);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0xcb,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        testing::Message::~Message(&local_198);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
      if (buffer_00 != (char *)0x0) {
        operator_delete__(buffer_00);
      }
      OpenDDLParser::~OpenDDLParser((OpenDDLParser *)local_78);
      return;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64 <
        gtest_ar_.message_.ptr_) {
      parserBuffer._7_1_ = false;
      goto LAB_0016294e;
    }
    if (buffer_00[(long)gtest_ar_.message_.ptr_] != pcVar3[(long)gtest_ar_.message_.ptr_]) {
      parserBuffer._7_1_ = false;
      goto LAB_0016294e;
    }
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(gtest_ar_.message_.ptr_)->field_0x1;
  } while( true );
}

Assistant:

TEST_F(OpenDDLParserTest, accessBufferTest) {
    static const size_t len = 100;
    char *buffer = new char[len];
    for (size_t i = 0; i < len; i++) {
        buffer[i] = (char)i;
    }
    OpenDDLParser myParser;
    myParser.setBuffer(buffer, len);
    EXPECT_EQ(len, myParser.getBufferSize());
    bool equal(true);
    const char *parserBuffer(myParser.getBuffer());
    for (size_t i = 0; i < myParser.getBufferSize(); i++) {
        if (i > len) {
            equal = false;
            break;
        }
        if (buffer[i] != parserBuffer[i]) {
            equal = false;
            break;
        }
    }
    EXPECT_TRUE(equal);

    bool success(true);
    try {
        myParser.clear();
        buffer[1] = 'c';
    } catch (...) {
        success = false;
    }
    EXPECT_TRUE(success);

    myParser.setBuffer(buffer, len);
    myParser.clear();
    EXPECT_EQ(0U, myParser.getBufferSize());
    EXPECT_EQ(nullptr, myParser.getBuffer());
    delete[] buffer;
}